

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_util.cc
# Opt level: O0

bool __thiscall ScopedProcess::Wait(ScopedProcess *this,int *out_status)

{
  ssize_t sVar1;
  int *out_status_local;
  ScopedProcess *this_local;
  
  if (this->pid_ < 0) {
    this_local._7_1_ = false;
  }
  else {
    sVar1 = waitpid_eintr(this->pid_,out_status,0);
    if (sVar1 == this->pid_) {
      this->pid_ = -1;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Wait(int *out_status) {
    if (pid_ < 0) {
      return false;
    }
    if (waitpid_eintr(pid_, out_status, 0) != pid_) {
      return false;
    }
    pid_ = -1;
    return true;
  }